

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O0

string * tinyusdz::value::print_array_snipped<int>
                   (string *__return_storage_ptr__,vector<int,_std::allocator<int>_> *vals,size_t N)

{
  size_t sVar1;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  unsigned_long *puVar5;
  unsigned_long local_1e0;
  size_t i_2;
  size_t i_1;
  unsigned_long local_1c8;
  size_t tail_start;
  unsigned_long local_1b8;
  size_t head_end;
  size_t i;
  stringstream os;
  ostream aoStack_198 [376];
  size_t local_20;
  size_t N_local;
  vector<int,_std::allocator<int>_> *vals_local;
  
  local_20 = N;
  N_local = (size_t)vals;
  vals_local = (vector<int,_std::allocator<int>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&i);
  if (local_20 != 0) {
    uVar2 = local_20 << 1;
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)N_local);
    if (uVar2 < sVar3) {
      tail_start = ::std::vector<int,_std::allocator<int>_>::size
                             ((vector<int,_std::allocator<int>_> *)N_local);
      puVar5 = ::std::min<unsigned_long>(&local_20,&tail_start);
      local_1b8 = *puVar5;
      sVar3 = ::std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)N_local);
      i_1 = sVar3 - local_20;
      puVar5 = std::max<unsigned_long>(&i_1,&local_1b8);
      local_1c8 = *puVar5;
      ::std::operator<<(aoStack_198,"[");
      for (i_2 = 0; i_2 < local_1b8; i_2 = i_2 + 1) {
        if (i_2 != 0) {
          ::std::operator<<(aoStack_198,", ");
        }
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)N_local,i_2);
        ::std::ostream::operator<<(aoStack_198,*pvVar4);
      }
      ::std::operator<<(aoStack_198,", ..., ");
      local_1e0 = local_1c8;
      while( true ) {
        sVar3 = ::std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)N_local);
        if (sVar3 <= local_1e0) break;
        if (local_1c8 < local_1e0) {
          ::std::operator<<(aoStack_198,", ");
        }
        pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)N_local,local_1e0);
        ::std::ostream::operator<<(aoStack_198,*pvVar4);
        local_1e0 = local_1e0 + 1;
      }
      ::std::operator<<(aoStack_198,"]");
      goto LAB_00569563;
    }
  }
  ::std::operator<<(aoStack_198,"[");
  head_end = 0;
  while( true ) {
    sVar1 = head_end;
    sVar3 = ::std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)N_local);
    if (sVar3 <= sVar1) break;
    if (head_end != 0) {
      ::std::operator<<(aoStack_198,", ");
    }
    pvVar4 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)N_local,head_end);
    ::std::ostream::operator<<(aoStack_198,*pvVar4);
    head_end = head_end + 1;
  }
  ::std::operator<<(aoStack_198,"]");
LAB_00569563:
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string print_array_snipped(const std::vector<T> &vals, size_t N = 16) {
  std::stringstream os;

  if ((N == 0) || ((N * 2) >= vals.size())) {
    os << "[";
    for (size_t i = 0; i < vals.size(); i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }
    os << "]";
  } else {
    size_t head_end = (std::min)(N, vals.size());
    size_t tail_start = (std::max)(vals.size() - N, head_end);

    os << "[";

    for (size_t i = 0; i < head_end; i++) {
      if (i > 0) {
        os << ", ";
      }
      os << vals[i];
    }

    os << ", ..., ";

    for (size_t i = tail_start; i < vals.size(); i++) {
      if (i > tail_start) {
        os << ", ";
      }
      os << vals[i];
    }

    os << "]";
  }
  return os.str();
}